

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

void assign_adjust(LexState *ls,BCReg nvars,BCReg nexps,ExpDesc *e)

{
  BCReg BVar1;
  uint *in_RCX;
  int in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  BCReg reg;
  int32_t extra;
  FuncState *fs;
  undefined4 in_stack_ffffffffffffffd8;
  FuncState *fs_00;
  
  fs_00 = (FuncState *)*in_RDI;
  BVar1 = in_ESI - in_EDX;
  if (in_RCX[2] == 0xd) {
    BVar1 = BVar1 + 1;
    if ((int)BVar1 < 0) {
      BVar1 = 0;
    }
    *(char *)((long)&fs_00->bcbase[*in_RCX].ins + 3) = (char)BVar1 + '\x01';
    if (1 < (int)BVar1) {
      bcreg_reserve(fs_00,BVar1);
    }
  }
  else {
    if (in_RCX[2] != 0xe) {
      expr_tonextreg(fs_00,(ExpDesc *)CONCAT44(BVar1,in_stack_ffffffffffffffd8));
    }
    if (0 < (int)BVar1) {
      bcreg_reserve(fs_00,BVar1);
      bcemit_nil(_reg,(BCReg)((ulong)in_RDI >> 0x20),(BCReg)in_RDI);
    }
  }
  return;
}

Assistant:

static void assign_adjust(LexState *ls, BCReg nvars, BCReg nexps, ExpDesc *e)
{
  FuncState *fs = ls->fs;
  int32_t extra = (int32_t)nvars - (int32_t)nexps;
  if (e->k == VCALL) {
    extra++;  /* Compensate for the VCALL itself. */
    if (extra < 0) extra = 0;
    setbc_b(bcptr(fs, e), extra+1);  /* Fixup call results. */
    if (extra > 1) bcreg_reserve(fs, (BCReg)extra-1);
  } else {
    if (e->k != VVOID)
      expr_tonextreg(fs, e);  /* Close last expression. */
    if (extra > 0) {  /* Leftover LHS are set to nil. */
      BCReg reg = fs->freereg;
      bcreg_reserve(fs, (BCReg)extra);
      bcemit_nil(fs, reg, (BCReg)extra);
    }
  }
}